

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::ViewportArray::ViewportAPI::iterate(ViewportAPI *this)

{
  pointer *ppfVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar7;
  TestContext *pTVar8;
  value_type local_e0;
  int local_80;
  int local_7c;
  GLint i_4;
  GLint j_1;
  GLint j;
  GLfloat value;
  GLint i_3;
  GLint i_2;
  GLint i_1;
  GLint i;
  vector<float,_std::allocator<float>_> scissor_box_data_b;
  vector<float,_std::allocator<float>_> scissor_box_data_a;
  GLint max_viewports;
  bool test_result;
  Functions *gl;
  ViewportAPI *this_local;
  long lVar6;
  
  if (((this->super_TestCaseBase).m_is_viewport_array_supported & 1U) != 0) {
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar3 = (*pRVar5->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar3);
    scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    (**(code **)(lVar6 + 0x868))
              (0x825b,&scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6cb);
    ppfVar1 = &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)ppfVar1);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i_1);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)ppfVar1,
               (ulong)(uint)((int)scissor_box_data_a.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage << 2));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&i_1,
               (ulong)(uint)((int)scissor_box_data_a.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage << 2));
    getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<float,_std::allocator<float>_> *)
                 &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    for (i_2 = 0; iVar3 = (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
        i_2 < (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage; i_2 = i_2 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)(i_2 << 2)
                         );
      *pvVar7 = *pvVar7 + 0.125;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 1));
      *pvVar7 = *pvVar7 + 0.125;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 2));
      *pvVar7 = *pvVar7 - 0.125;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 3));
      *pvVar7 = *pvVar7 - 0.125;
    }
    pcVar2 = *(code **)(lVar6 + 0x1a08);
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(0,iVar3,pvVar7);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"viewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6e4);
    getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<float,_std::allocator<float>_> *)&i_1);
    compareViewports(this,(vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<float,_std::allocator<float>_> *)&i_1,"viewportArrayv",
                     (bool *)((long)&scissor_box_data_a.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 7));
    for (i_3 = 0; i_3 < (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage; i_3 = i_3 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)(i_3 << 2));
      *pvVar7 = 0.25;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_3 * 4 + 1));
      *pvVar7 = 0.25;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_3 * 4 + 2));
      *pvVar7 = 0.75;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_3 * 4 + 3));
      *pvVar7 = 0.75;
      (**(code **)(lVar6 + 0x1a10))(0x3e800000,0x3e800000,0x3f400000,i_3);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"viewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x6f6);
      getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<float,_std::allocator<float>_> *)
                   &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      compareViewports(this,(vector<float,_std::allocator<float>_> *)
                            &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<float,_std::allocator<float>_> *)&i_1,"viewportIndexedf",
                       (bool *)((long)&scissor_box_data_a.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (value = 0.0;
        (int)value <
        (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; value = (GLfloat)((int)value + 1)) {
      ppfVar1 = &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,
                          (ulong)(uint)((int)value << 2));
      *pvVar7 = 0.375;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,
                          (ulong)((int)value * 4 + 1));
      *pvVar7 = 0.375;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,
                          (ulong)((int)value * 4 + 2));
      *pvVar7 = 0.625;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,
                          (ulong)((int)value * 4 + 3));
      *pvVar7 = 0.625;
      pcVar2 = *(code **)(lVar6 + 0x1a18);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,
                          (ulong)(uint)((int)value << 2));
      (*pcVar2)(value,pvVar7);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"viewportIndexedfv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x709);
      getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<float,_std::allocator<float>_> *)&i_1);
      compareViewports(this,(vector<float,_std::allocator<float>_> *)
                            &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<float,_std::allocator<float>_> *)&i_1,"viewportIndexedfv",
                       (bool *)((long)&scissor_box_data_a.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (j = 0; j < (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage; j = j + 1) {
      local_e0 = 1.0;
      if (j % 2 != 0) {
        local_e0 = 0.25;
      }
      for (i_4 = 0; local_7c = j, i_4 < j; i_4 = i_4 + 1) {
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)(i_4 << 2));
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_4 * 4 + 1));
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_4 * 4 + 2));
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_4 * 4 + 3));
        *pvVar7 = local_e0;
      }
      while (iVar3 = (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage, local_7c = local_7c + 1
            , local_7c <
              (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,
                            (ulong)(uint)(local_7c * 4));
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(local_7c * 4 + 1))
        ;
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(local_7c * 4 + 2))
        ;
        *pvVar7 = local_e0;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(local_7c * 4 + 3))
        ;
        *pvVar7 = local_e0;
      }
      pcVar2 = *(code **)(lVar6 + 0x1a08);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,0);
      (*pcVar2)(0,iVar3,pvVar7);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"viewportArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x729);
      getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<float,_std::allocator<float>_> *)
                   &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      compareViewports(this,(vector<float,_std::allocator<float>_> *)
                            &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<float,_std::allocator<float>_> *)&i_1,"viewportArrayv",
                       (bool *)((long)&scissor_box_data_a.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (local_80 = 0;
        local_80 <
        (int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_80 = local_80 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(uint)(local_80 << 2));
      *pvVar7 = 0.0;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(local_80 * 4 + 1));
      *pvVar7 = 0.0;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(local_80 * 4 + 2));
      *pvVar7 = 1.0;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(local_80 * 4 + 3));
      *pvVar7 = 1.0;
    }
    (**(code **)(lVar6 + 0x1a00))(0,0,1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x73c);
    getViewports(this,(int)scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<float,_std::allocator<float>_> *)&i_1);
    compareViewports(this,(vector<float,_std::allocator<float>_> *)
                          &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<float,_std::allocator<float>_> *)&i_1,"viewport",
                     (bool *)((long)&scissor_box_data_a.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 7));
    if ((scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 1) {
      pTVar8 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
      tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      pTVar8 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
      tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,"Fail");
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&i_1);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x6bf);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult ViewportAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLfloat> scissor_box_data_a;
	std::vector<GLfloat> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of VIEWPORT for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ViewportArrayv;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	getViewports(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 1] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 2] -= 0.125f;
		scissor_box_data_a[i * m_n_elements + 3] -= 0.125f;
	}

	gl.viewportArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedf,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 1] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 2] = 0.75f;
		scissor_box_data_b[i * m_n_elements + 3] = 0.75f;

		gl.viewportIndexedf(i, 0.25f, 0.25f, 0.75f, 0.75f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedf");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedf", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedfv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 2] = 0.625f;
		scissor_box_data_a[i * m_n_elements + 3] = 0.625f;

		gl.viewportIndexedfv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedfv");

		getViewports(max_viewports, scissor_box_data_b);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedfv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ViewportArrayv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLfloat value = (0 == i % 2) ? 1.0f : 0.25f;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.viewportArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Viewport;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 2] = 1.0f;
		scissor_box_data_a[i * m_n_elements + 3] = 1.0f;
	}

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewport", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}